

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

ClosureContext __thiscall
runtime::VirtualMachine::loadClosure(VirtualMachine *this,ClosureContext *closure)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar1;
  ClosureContext CVar2;
  string local_80;
  undefined1 local_60 [8];
  shared_ptr<runtime::StackFrame> outer;
  shared_ptr<runtime::StackFrame> scope;
  allocator<char> local_31;
  
  this_00 = &outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             &(this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  uVar1 = 1;
  while( true ) {
    if (closure->scopeOffsets <= uVar1) {
      uVar1 = closure->localIndex;
      if (uVar1 < (ulong)((long)outer.
                                super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi[1]._vptr__Sp_counted_base -
                          *(long *)&(outer.
                                     super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count >> 4)) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&scope);
        CVar2.scopeIndex = uVar1;
        CVar2.stackFrame =
             (StackFrame *)
             outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        return CVar2;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,
                 "closure.localIndex out of bounds for scope when trying to find closure value",
                 (allocator<char> *)local_60);
      panic((VirtualMachine *)
            scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi,&local_80);
    }
    std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)local_60,
               (__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)
               (outer.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[2]._vptr__Sp_counted_base + 3));
    if (local_60 == (undefined1  [8])0x0) break;
    std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&outer);
    uVar1 = uVar1 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"No outer scope found for closure",&local_31);
  panic((VirtualMachine *)
        scope.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
        &local_80);
}

Assistant:

runtime::ClosureContext runtime::VirtualMachine::loadClosure(const bytecode::ClosureContext& closure) {
  // we start at offset of 1 because those offsets are determined from within the function scope
  // are we are not technically within the function scope also offset of zero means local
  auto scope = this->stackFrame;
  for (std::size_t i = 1; i < closure.scopeOffsets; i++) {
    auto outer = scope->function->scopeOuter;
    if (outer == nullptr) {
      this->panic("No outer scope found for closure");
    }
    scope = outer;
  }

  if (closure.localIndex >= scope->locals.size()) {
    this->panic("closure.localIndex out of bounds for scope when trying to find closure value");
  }

  runtime::ClosureContext cc;
  cc.stackFrame = scope.get();
  cc.scopeIndex = closure.localIndex;
  return cc;
}